

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::UpdateForFixtures(cmCTestTestHandler *this,ListOfTests *tests)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *range;
  cmCTest *pcVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  value_type *pvVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  _Var9;
  _Rb_tree_node_base *p_Var10;
  iterator iVar11;
  cmCTestTestProperties *p;
  pointer pcVar12;
  pointer pcVar13;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  sIt;
  ListOfTests *__range1;
  _Base_ptr p_Var14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  pVar15;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  ulong local_528;
  _Rb_tree_node_base *local_520;
  long local_518;
  FixtureDependencies fixtureSetups;
  string cleanupRegExp;
  string setupRegExp;
  char *local_488 [4];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fixtures;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedTests;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  setupFixturesAdded;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  fixtureRequirements;
  FixtureDependencies fixtureCleanups;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFixtures;
  ostringstream cmCTestLog_msg;
  RegularExpression excludeSetupRegex;
  RegularExpression excludeCleanupRegex;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Updating test list for fixtures");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x3d3,excludeSetupRegex.regmatch.startp[0],(this->super_cmCTestGenericHandler).Quiet
              );
  std::__cxx11::string::~string((string *)&excludeSetupRegex);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&setupRegExp,(string *)&this->ExcludeFixtureRegExp);
  std::__cxx11::string::string((string *)&cleanupRegExp,(string *)&this->ExcludeFixtureRegExp);
  if ((this->ExcludeFixtureSetupRegExp)._M_string_length != 0) {
    if (setupRegExp._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&setupRegExp);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fixtureSetups,"(",&setupRegExp);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeCleanupRegex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fixtureSetups,")|(");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeSetupRegex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeCleanupRegex,&this->ExcludeFixtureSetupRegExp);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeSetupRegex,")");
      std::__cxx11::string::append((string *)&setupRegExp);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&excludeSetupRegex);
      std::__cxx11::string::~string((string *)&excludeCleanupRegex);
      std::__cxx11::string::~string((string *)&fixtureSetups);
    }
  }
  if ((this->ExcludeFixtureCleanupRegExp)._M_string_length != 0) {
    if (cleanupRegExp._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&cleanupRegExp);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fixtureSetups,"(",&cleanupRegExp);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeCleanupRegex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fixtureSetups,")|(");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeSetupRegex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeCleanupRegex,&this->ExcludeFixtureCleanupRegExp);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &excludeSetupRegex,")");
      std::__cxx11::string::append((string *)&cleanupRegExp);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&excludeSetupRegex);
      std::__cxx11::string::~string((string *)&excludeCleanupRegex);
      std::__cxx11::string::~string((string *)&fixtureSetups);
    }
  }
  cmsys::RegularExpression::RegularExpression(&excludeSetupRegex,&setupRegExp);
  cmsys::RegularExpression::RegularExpression(&excludeCleanupRegex,&cleanupRegExp);
  fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header;
  fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header;
  fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixtureSetups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixtureCleanups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pcVar12 = (this->TestList).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pcVar12 !=
      (this->TestList).
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish; pcVar12 = pcVar12 + 1) {
    for (p_Var7 = (pcVar12->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pcVar12->FixturesSetup)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      std::__cxx11::string::string((string *)&cmCTestLog_msg,(string *)(p_Var7 + 1));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
      ::
      _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                  *)&fixtureSetups,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                  *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    for (p_Var7 = (pcVar12->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pcVar12->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      std::__cxx11::string::string((string *)&cmCTestLog_msg,(string *)(p_Var7 + 1));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
      ::
      _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                  *)&fixtureCleanups,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                  *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  addedTests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &addedTests._M_t._M_impl.super__Rb_tree_header._M_header;
  addedTests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  addedTests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addedTests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (tests->
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  addedTests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       addedTests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pcVar12 = (tests->
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 )._M_impl.super__Vector_impl_data._M_start; pcVar12 != pcVar2;
      pcVar12 = pcVar12 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&addedTests,&pcVar12->Name);
  }
  fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header;
  fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header;
  setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header;
  addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  addedFixtures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528 = 0;
  local_518 = 0;
  setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setupFixturesAdded._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixtureRequirements._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       addedFixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pcVar12 = (tests->
              super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (tests->
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pcVar2 - (long)pcVar12) / 0x300) <= local_528) break;
    if (pcVar12[local_528].Disabled == false) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&fixtures._M_t,&pcVar12[local_528].FixturesRequired._M_t);
      p_Var7 = fixtures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var7 != &fixtures._M_t._M_impl.super__Rb_tree_header) {
        local_520 = p_Var7;
        if (p_Var7[1]._M_parent != (_Base_ptr)0x0) {
          p_Var10 = p_Var7 + 1;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator[](&fixtureRequirements,(key_type *)p_Var10);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pmVar8,&local_528);
          pVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                   ::equal_range(&fixtureSetups._M_t,(key_type *)p_Var10);
          for (_Var9 = pVar15.first._M_node; _Var9._M_node != pVar15.second._M_node._M_node;
              _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
            __v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (_Var9._M_node + 2);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(tests->
                           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                           )._M_impl.super__Vector_impl_data._M_start[local_528].
                           RequireSuccessDepends,__v);
            bVar5 = ::cm::
                    contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&(tests->
                                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                )._M_impl.super__Vector_impl_data._M_start[local_528].Depends,__v);
            if (!bVar5) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&(tests->
                           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                           )._M_impl.super__Vector_impl_data._M_start[local_528].Depends,__v);
            }
          }
          pVar16 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&addedFixtures,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var10);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((setupRegExp._M_string_length == 0) ||
               (bVar5 = cmsys::RegularExpression::find(&excludeSetupRegex,(string *)p_Var10), !bVar5
               )) {
              pVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                       ::equal_range(&fixtureSetups._M_t,(key_type *)p_Var10);
              for (_Var9 = pVar15.first._M_node; _Var9._M_node != pVar15.second._M_node._M_node;
                  _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
                pvVar3 = *(value_type **)(_Var9._M_node + 2);
                pVar16 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string_const&>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)&addedTests,&pvVar3->Name);
                if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  std::
                  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ::push_back(tests,pvVar3);
                  (tests->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                       (int)(((long)pvVar3 -
                             (long)(this->TestList).
                                   super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x300) + 1;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Added setup test ");
                  poVar6 = std::operator<<(poVar6,(string *)pvVar3);
                  poVar6 = std::operator<<(poVar6," required by fixture ");
                  poVar6 = std::operator<<(poVar6,(string *)p_Var10);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                               ,0x45d,local_488[0],(this->super_cmCTestGenericHandler).Quiet);
                  local_518 = local_518 + 1;
                  std::__cxx11::string::~string((string *)local_488);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                }
              }
            }
            if ((cleanupRegExp._M_string_length == 0) ||
               (bVar5 = cmsys::RegularExpression::find(&excludeCleanupRegex,(string *)p_Var10),
               !bVar5)) {
              pVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                       ::equal_range(&fixtureCleanups._M_t,(key_type *)p_Var10);
              for (_Var9 = pVar15.first._M_node; _Var9._M_node != pVar15.second._M_node._M_node;
                  _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
                pvVar3 = *(value_type **)(_Var9._M_node + 2);
                pVar16 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string_const&>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)&addedTests,&pvVar3->Name);
                if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  std::
                  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ::push_back(tests,pvVar3);
                  (tests->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                       (int)(((long)pvVar3 -
                             (long)(this->TestList).
                                   super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x300) + 1;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Added cleanup test ");
                  poVar6 = std::operator<<(poVar6,(string *)pvVar3);
                  poVar6 = std::operator<<(poVar6," required by fixture ");
                  poVar6 = std::operator<<(poVar6,(string *)p_Var10);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                               ,0x47c,local_488[0],(this->super_cmCTestGenericHandler).Quiet);
                  local_518 = local_518 + 1;
                  std::__cxx11::string::~string((string *)local_488);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                }
              }
            }
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_520);
      }
      pcVar12 = (tests->
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = pcVar12 + local_528;
      for (p_Var10 = *(_Base_ptr *)((long)&pcVar12[local_528].FixturesSetup._M_t._M_impl + 0x18);
          p_Var10 != (_Rb_tree_node_base *)((long)&(pcVar2->FixturesSetup)._M_t._M_impl + 8U);
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        if (p_Var10[1]._M_parent != (_Base_ptr)0x0) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator[](&setupFixturesAdded,(key_type *)(p_Var10 + 1));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pmVar8,&local_528);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&fixtures._M_t);
    }
    local_528 = local_528 + 1;
  }
  for (; pcVar12 != pcVar2; pcVar12 = pcVar12 + 1) {
    range = &pcVar12->Depends;
    p_Var7 = (pcVar12->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var7 !=
           &(pcVar12->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header) {
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::find(&fixtureRequirements._M_t,(key_type *)(p_Var7 + 1));
      local_520 = p_Var7;
      if ((_Rb_tree_header *)iVar11._M_node !=
          &fixtureRequirements._M_t._M_impl.super__Rb_tree_header) {
        p_Var4 = iVar11._M_node[2]._M_parent;
        for (p_Var14 = *(_Base_ptr *)(iVar11._M_node + 2); p_Var14 != p_Var4;
            p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
          pcVar13 = (tests->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var14;
          bVar5 = ::cm::
                  contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (range,&pcVar13->Name);
          if (!bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(range,&pcVar13->Name);
          }
        }
      }
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::find(&setupFixturesAdded._M_t,(key_type *)(p_Var7 + 1));
      if ((_Rb_tree_header *)iVar11._M_node !=
          &setupFixturesAdded._M_t._M_impl.super__Rb_tree_header) {
        p_Var14 = iVar11._M_node[2]._M_parent;
        for (p_Var7 = *(_Base_ptr *)(iVar11._M_node + 2); p_Var7 != p_Var14;
            p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
          pcVar13 = (tests->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var7;
          bVar5 = ::cm::
                  contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (range,&pcVar13->Name);
          if (!bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(range,&pcVar13->Name);
          }
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_520);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Added ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," tests to meet fixture requirements");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x4b4,(char *)fixtures._M_t._M_impl._0_8_,(this->super_cmCTestGenericHandler).Quiet)
  ;
  std::__cxx11::string::~string((string *)&fixtures);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&addedFixtures._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&setupFixturesAdded._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&fixtureRequirements._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&addedTests._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree(&fixtureCleanups._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree(&fixtureSetups._M_t);
  cmsys::RegularExpression::~RegularExpression(&excludeCleanupRegex);
  cmsys::RegularExpression::~RegularExpression(&excludeSetupRegex);
  std::__cxx11::string::~string((string *)&cleanupRegExp);
  std::__cxx11::string::~string((string *)&setupRegExp);
  return;
}

Assistant:

void cmCTestTestHandler::UpdateForFixtures(ListOfTests& tests) const
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Updating test list for fixtures" << std::endl,
                     this->Quiet);

  // Prepare regular expression evaluators
  std::string setupRegExp(this->ExcludeFixtureRegExp);
  std::string cleanupRegExp(this->ExcludeFixtureRegExp);
  if (!this->ExcludeFixtureSetupRegExp.empty()) {
    if (setupRegExp.empty()) {
      setupRegExp = this->ExcludeFixtureSetupRegExp;
    } else {
      setupRegExp.append("(" + setupRegExp + ")|(" +
                         this->ExcludeFixtureSetupRegExp + ")");
    }
  }
  if (!this->ExcludeFixtureCleanupRegExp.empty()) {
    if (cleanupRegExp.empty()) {
      cleanupRegExp = this->ExcludeFixtureCleanupRegExp;
    } else {
      cleanupRegExp.append("(" + cleanupRegExp + ")|(" +
                           this->ExcludeFixtureCleanupRegExp + ")");
    }
  }
  cmsys::RegularExpression excludeSetupRegex(setupRegExp);
  cmsys::RegularExpression excludeCleanupRegex(cleanupRegExp);

  // Prepare some maps to help us find setup and cleanup tests for
  // any given fixture
  using TestIterator = ListOfTests::const_iterator;
  using FixtureDependencies = std::multimap<std::string, TestIterator>;
  using FixtureDepsIterator = FixtureDependencies::const_iterator;
  FixtureDependencies fixtureSetups;
  FixtureDependencies fixtureCleanups;

  for (auto it = this->TestList.begin(); it != this->TestList.end(); ++it) {
    const cmCTestTestProperties& p = *it;

    for (std::string const& deps : p.FixturesSetup) {
      fixtureSetups.insert(std::make_pair(deps, it));
    }

    for (std::string const& deps : p.FixturesCleanup) {
      fixtureCleanups.insert(std::make_pair(deps, it));
    }
  }

  // Prepare fast lookup of tests already included in our list of tests
  std::set<std::string> addedTests;
  for (cmCTestTestProperties const& p : tests) {
    addedTests.insert(p.Name);
  }

  // These are lookups of fixture name to a list of indices into the final
  // tests array for tests which require that fixture and tests which are
  // setups for that fixture. They are needed at the end to populate
  // dependencies of the cleanup tests in our final list of tests.
  std::map<std::string, std::vector<size_t>> fixtureRequirements;
  std::map<std::string, std::vector<size_t>> setupFixturesAdded;

  // Use integer index for iteration because we append to
  // the tests vector as we go
  size_t fixtureTestsAdded = 0;
  std::set<std::string> addedFixtures;
  for (size_t i = 0; i < tests.size(); ++i) {
    // Skip disabled tests
    if (tests[i].Disabled) {
      continue;
    }

    // There are two things to do for each test:
    //   1. For every fixture required by this test, record that fixture as
    //      being required and create dependencies on that fixture's setup
    //      tests.
    //   2. Record all setup tests in the final test list so we can later make
    //      cleanup tests in the test list depend on their associated setup
    //      tests to enforce correct ordering.

    // 1. Handle fixture requirements
    //
    // Must copy the set of fixtures required because we may invalidate
    // the tests array by appending to it
    std::set<std::string> fixtures = tests[i].FixturesRequired;
    for (std::string const& requiredFixtureName : fixtures) {
      if (requiredFixtureName.empty()) {
        continue;
      }

      fixtureRequirements[requiredFixtureName].push_back(i);

      // Add dependencies to this test for all of the setup tests
      // associated with the required fixture. If any of those setup
      // tests fail, this test should not run. We make the fixture's
      // cleanup tests depend on this test case later.
      std::pair<FixtureDepsIterator, FixtureDepsIterator> setupRange =
        fixtureSetups.equal_range(requiredFixtureName);
      for (auto sIt = setupRange.first; sIt != setupRange.second; ++sIt) {
        const std::string& setupTestName = sIt->second->Name;
        tests[i].RequireSuccessDepends.insert(setupTestName);
        if (!cm::contains(tests[i].Depends, setupTestName)) {
          tests[i].Depends.push_back(setupTestName);
        }
      }

      // Append any fixture setup/cleanup tests to our test list if they
      // are not already in it (they could have been in the original
      // set of tests passed to us at the outset or have already been
      // added from a previously checked test). A fixture isn't required
      // to have setup/cleanup tests.
      if (!addedFixtures.insert(requiredFixtureName).second) {
        // Already seen this fixture, no need to check it again
        continue;
      }

      // Only add setup tests if this fixture has not been excluded
      if (setupRegExp.empty() ||
          !excludeSetupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureSetups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added setup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }

      // Only add cleanup tests if this fixture has not been excluded
      if (cleanupRegExp.empty() ||
          !excludeCleanupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureCleanups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added cleanup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }
    }

    // 2. Record all setup fixtures included in the final list of tests
    for (std::string const& setupFixtureName : tests[i].FixturesSetup) {
      if (setupFixtureName.empty()) {
        continue;
      }

      setupFixturesAdded[setupFixtureName].push_back(i);
    }
  }

  // Now that we have the final list of tests, we can update all cleanup
  // tests to depend on those tests which require that fixture and on any
  // setup tests for that fixture. The latter is required to handle the
  // pathological case where setup and cleanup tests are in the test set
  // but no other test has that fixture as a requirement.
  for (cmCTestTestProperties& p : tests) {
    const std::set<std::string>& cleanups = p.FixturesCleanup;
    for (std::string const& fixture : cleanups) {
      // This cleanup test could be part of the original test list that was
      // passed in. It is then possible that no other test requires the
      // fIt fixture, so we have to check for this.
      auto cIt = fixtureRequirements.find(fixture);
      if (cIt != fixtureRequirements.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& reqTestName = tests[index].Name;
          if (!cm::contains(p.Depends, reqTestName)) {
            p.Depends.push_back(reqTestName);
          }
        }
      }

      // Ensure fixture cleanup tests always run after their setup tests, even
      // if no other test cases require the fixture
      cIt = setupFixturesAdded.find(fixture);
      if (cIt != setupFixturesAdded.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& setupTestName = tests[index].Name;
          if (!cm::contains(p.Depends, setupTestName)) {
            p.Depends.push_back(setupTestName);
          }
        }
      }
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Added " << fixtureTestsAdded
                              << " tests to meet fixture requirements"
                              << std::endl,
                     this->Quiet);
}